

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O3

vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
* __thiscall
backend::codegen::RegAllocator::sort_intervals
          (vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
           *__return_storage_ptr__,RegAllocator *this)

{
  uint uVar1;
  uint uVar2;
  undefined8 uVar3;
  Interval IVar4;
  long lVar5;
  _Hash_node_base *p_Var6;
  pointer ppVar7;
  pointer ppVar8;
  Interval *pIVar9;
  uint uVar10;
  ulong uVar11;
  Interval *pIVar12;
  pointer ppVar13;
  __normal_iterator<std::pair<unsigned_int,_backend::codegen::Interval>_*,_std::vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>_>
  __i;
  _Hash_node_base *p_Var14;
  long lVar15;
  pointer ppVar16;
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  local_48;
  pair<unsigned_int,_backend::codegen::Interval> local_2c;
  
  local_48.
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  ::reserve(&local_48,(this->live_intervals)._M_h._M_element_count);
  p_Var14 = (this->live_intervals)._M_h._M_before_begin._M_nxt;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    do {
      local_2c.first = *(uint *)&p_Var14[1]._M_nxt;
      uVar3 = *(undefined8 *)((long)&p_Var14[1]._M_nxt + 4);
      p_Var6 = p_Var14[1]._M_nxt;
      local_2c.second.start = (uint)uVar3;
      local_2c.second.end = (uint)((ulong)uVar3 >> 0x20);
      if (local_48.
          super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
          ._M_impl.super__Vector_impl_data._M_finish ==
          local_48.
          super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>
        ::_M_realloc_insert<std::pair<unsigned_int,backend::codegen::Interval>>
                  ((vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>
                    *)&local_48,
                   (iterator)
                   local_48.
                   super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,&local_2c);
      }
      else {
        ((local_48.
          super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
          ._M_impl.super__Vector_impl_data._M_finish)->second).end = local_2c.second.end;
        *(_Hash_node_base **)
         local_48.
         super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
         ._M_impl.super__Vector_impl_data._M_finish = p_Var6;
        local_48.
        super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_48.
             super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  ppVar8 = local_48.
           super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar7 = local_48.
           super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (local_48.
      super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_48.
      super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar15 = (long)local_48.
                   super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_48.
                   super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    uVar11 = (lVar15 >> 2) * -0x5555555555555555;
    lVar5 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,backend::codegen::Interval>*,std::vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<backend::codegen::RegAllocator::sort_intervals()::__0>>
              (local_48.
               super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_48.
               super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar5 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar15 < 0xc1) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,backend::codegen::Interval>*,std::vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>>,__gnu_cxx::__ops::_Iter_comp_iter<backend::codegen::RegAllocator::sort_intervals()::__0>>
                (ppVar7,ppVar8);
    }
    else {
      ppVar16 = ppVar7 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_int,backend::codegen::Interval>*,std::vector<std::pair<unsigned_int,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int,backend::codegen::Interval>>>>,__gnu_cxx::__ops::_Iter_comp_iter<backend::codegen::RegAllocator::sort_intervals()::__0>>
                (ppVar7,ppVar16);
      if (ppVar16 != ppVar8) {
        ppVar7 = ppVar7 + 0x10;
        do {
          uVar1 = ppVar16->first;
          IVar4 = ppVar16->second;
          uVar10 = IVar4.start;
          ppVar13 = ppVar16;
          pIVar9 = &ppVar7->second;
          if (uVar10 < ppVar16[-1].second.start) {
            do {
              pIVar12 = pIVar9;
              uVar2 = pIVar12[-3].start;
              pIVar12[-1].end = pIVar12[-2].start;
              *pIVar12 = *(Interval *)&pIVar12[-2].end;
              pIVar9 = (Interval *)&pIVar12[-2].end;
            } while (uVar10 < uVar2);
            ppVar13 = (pointer)(pIVar12 + -2);
          }
          ppVar13->first = uVar1;
          ppVar13->second = IVar4;
          ppVar16 = ppVar16 + 1;
          ppVar7 = (pointer)(&ppVar7->second + 1);
        } while (ppVar16 != ppVar8);
      }
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  )._M_impl.super__Vector_impl_data._M_start =
       local_48.
       super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  )._M_impl.super__Vector_impl_data._M_finish =
       local_48.
       super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_48.
       super__Vector_base<std::pair<unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<unsigned_int,_backend::codegen::Interval>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::pair<Reg, Interval>> RegAllocator::sort_intervals() {
  //   Initialize vector
  std::vector<std::pair<Reg, Interval>> intervals;
  intervals.reserve(live_intervals.size());
  for (auto interval_pair : live_intervals) {
    intervals.push_back(interval_pair);
  }
  //   sort by interval starting point
  std::sort(intervals.begin(), intervals.end(), [](auto &first, auto &second) {
    return first.second.start < second.second.start;
  });

  return std::move(intervals);
}